

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O1

void test_compress(Byte *compr,uLong comprLen,Byte *uncompr,uLong uncomprLen)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  uint extraout_EAX;
  uint extraout_EAX_00;
  uint extraout_EAX_01;
  uint extraout_EAX_02;
  uint extraout_EAX_03;
  uint extraout_EAX_04;
  uint extraout_EAX_05;
  uint extraout_EAX_06;
  int iVar4;
  int extraout_EAX_07;
  size_t sVar5;
  char **ppcVar6;
  uLong *puVar7;
  long lVar8;
  size_t sVar9;
  undefined8 uVar10;
  Byte *compr_00;
  Byte *uncompr_00;
  ulong uVar11;
  ulong uVar12;
  ulong extraout_RDX;
  ulong *__s1;
  ulong *extraout_RDX_00;
  undefined8 *extraout_RDX_01;
  undefined8 *extraout_RDX_02;
  char *__s1_00;
  undefined8 unaff_RBP;
  undefined4 uVar13;
  char *pcVar14;
  char *pcVar15;
  ulong uVar16;
  ulong uVar17;
  char *pcVar18;
  uLong *puVar19;
  ulong *puVar20;
  ulong *puVar21;
  uint uVar22;
  char **unaff_R13;
  ulong **ppuVar23;
  uLong auStack_548 [2];
  undefined1 *puStack_538;
  char *pcStack_530;
  code *pcStack_528;
  ulong uStack_520;
  undefined4 uStack_518;
  undefined4 uStack_500;
  undefined8 uStack_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  uLong uStack_4c0;
  char *pcStack_4b0;
  undefined1 *puStack_4a8;
  code *pcStack_4a0;
  char *pcStack_498;
  int iStack_490;
  undefined1 *puStack_480;
  undefined4 uStack_478;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  uLong uStack_438;
  ulong uStack_420;
  code *pcStack_418;
  ulong uStack_408;
  uint uStack_400;
  undefined4 uStack_3e8;
  undefined8 uStack_3c8;
  undefined8 uStack_3c0;
  undefined8 uStack_3b8;
  char *pcStack_398;
  char *pcStack_390;
  ulong uStack_388;
  code *pcStack_380;
  char *pcStack_370;
  uint uStack_368;
  ulong uStack_358;
  undefined4 uStack_350;
  undefined8 uStack_348;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 uStack_320;
  long lStack_300;
  ulong *puStack_2f8;
  ulong uStack_2f0;
  code *pcStack_2e8;
  ulong uStack_2d8;
  undefined4 uStack_2d0;
  undefined4 uStack_2b8;
  ulong uStack_2b0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  ulong uStack_268;
  ulong *puStack_260;
  code *pcStack_250;
  ulong *puStack_248;
  uint uStack_240;
  ulong *puStack_230;
  uint uStack_228;
  undefined8 uStack_208;
  undefined8 uStack_200;
  undefined8 uStack_1f8;
  char *pcStack_1d0;
  char **ppcStack_1c8;
  ulong uStack_1c0;
  code *pcStack_1b8;
  ulong uStack_1b0;
  undefined4 uStack_1a8;
  ulong uStack_1a0;
  undefined4 uStack_190;
  ulong uStack_188;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  char *pcStack_140;
  char *pcStack_138;
  size_t sStack_130;
  uLong *puStack_128;
  code *pcStack_120;
  char *pcStack_110;
  undefined4 uStack_108;
  size_t sStack_100;
  uLong *puStack_f8;
  undefined4 uStack_f0;
  char *pcStack_e8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  uLong *puStack_a0;
  size_t sStack_98;
  char **ppcStack_90;
  uLong *puStack_80;
  char acStack_64 [4];
  Byte *pBStack_60;
  char *pcStack_58;
  uLong local_30;
  uLong local_28;
  
  pcVar14 = (char *)&local_28;
  local_30 = uncomprLen;
  local_28 = comprLen;
  sVar5 = strlen(hello);
  iVar2 = compress(compr,pcVar14,hello,sVar5 + 1);
  if (iVar2 == 0) {
    builtin_memcpy(uncompr,"garbage",8);
    pcVar14 = (char *)&local_30;
    uVar3 = uncompress(uncompr,pcVar14,compr,local_28);
    if (uVar3 != 0) goto LAB_00102c3c;
    pcVar14 = hello;
    puVar19 = (uLong *)uncompr;
    iVar2 = strcmp((char *)uncompr,hello);
    if (iVar2 == 0) {
      printf("uncompress(): %s\n",uncompr);
      return;
    }
  }
  else {
    test_compress_cold_1();
    uVar3 = extraout_EAX;
LAB_00102c3c:
    puVar19 = (uLong *)(ulong)uVar3;
    test_compress_cold_2();
  }
  test_compress_cold_3();
  pcStack_58 = hello;
  pBStack_60 = uncompr;
  sVar5 = strlen(hello);
  ppcVar6 = (char **)gzopen(puVar19,"wb");
  puVar7 = puVar19;
  if (ppcVar6 == (char **)0x0) {
LAB_00102e35:
    ppcVar6 = unaff_R13;
    test_gzio_cold_11();
LAB_00102e3a:
    test_gzio_cold_1();
LAB_00102e47:
    test_gzio_cold_2();
    puVar19 = puVar7;
LAB_00102e54:
    puVar7 = puVar19;
    test_gzio_cold_10();
LAB_00102e59:
    test_gzio_cold_3();
LAB_00102e66:
    test_gzio_cold_4();
LAB_00102e6e:
    test_gzio_cold_6();
LAB_00102e73:
    test_gzio_cold_7();
LAB_00102e78:
    pcVar15 = acStack_64;
    puVar19 = puVar7;
    test_gzio_cold_8();
  }
  else {
    gzputc(ppcVar6,0x68);
    iVar2 = gzputs(ppcVar6,"ello");
    if (iVar2 != 4) goto LAB_00102e3a;
    iVar2 = gzprintf(ppcVar6,", %s!","hello");
    if (iVar2 != 8) goto LAB_00102e47;
    gzseek(ppcVar6,1,1);
    gzclose(ppcVar6);
    puVar7 = (uLong *)gzopen(puVar19,"rb");
    if (puVar7 == (uLong *)0x0) goto LAB_00102e54;
    uVar22 = (int)sVar5 + 1;
    sVar5 = (size_t)uVar22;
    *(uLong *)pcVar14 = 0x65676162726167;
    uVar3 = gzread(puVar7,pcVar14,extraout_RDX & 0xffffffff);
    if (uVar3 != uVar22) goto LAB_00102e59;
    iVar2 = strcmp(pcVar14,hello);
    if (iVar2 != 0) goto LAB_00102e66;
    printf("gzread(): %s\n",pcVar14);
    sVar5 = gzseek(puVar7,0xfffffffffffffff8,1);
    if ((sVar5 != 6) || (lVar8 = gztell(puVar7), lVar8 != 6)) {
      test_gzio_cold_5();
      unaff_R13 = ppcVar6;
      goto LAB_00102e35;
    }
    if ((int)*puVar7 == 0) {
      uVar3 = gzgetc(puVar7);
    }
    else {
      *(int *)puVar7 = (int)*puVar7 + -1;
      puVar7[2] = puVar7[2] + 1;
      pbVar1 = (byte *)puVar7[1];
      puVar7[1] = (uLong)(pbVar1 + 1);
      uVar3 = (uint)*pbVar1;
    }
    if (uVar3 != 0x20) goto LAB_00102e6e;
    iVar2 = gzungetc(0x20,puVar7);
    if (iVar2 != 0x20) goto LAB_00102e73;
    gzgets(puVar7,pcVar14,extraout_RDX & 0xffffffff);
    sVar9 = strlen(pcVar14);
    if (sVar9 != 7) goto LAB_00102e78;
    pcVar15 = hello + 6;
    puVar19 = (uLong *)pcVar14;
    iVar2 = strcmp(pcVar14,hello + 6);
    if (iVar2 == 0) {
      printf("gzgets() after gzseek: %s\n",pcVar14);
      gzclose(puVar7);
      return;
    }
  }
  test_gzio_cold_9();
  pcStack_120 = (code *)0x102ead;
  puStack_a0 = (uLong *)pcVar14;
  sStack_98 = sVar5;
  ppcStack_90 = ppcVar6;
  puStack_80 = puVar7;
  sVar5 = strlen(hello);
  uStack_d0 = 0;
  uStack_c8 = 0;
  uStack_c0 = 0;
  uVar16 = 0xffffffff;
  uVar11 = 0x70;
  pcStack_120 = (code *)0x102eda;
  iVar2 = deflateInit_(&pcStack_110,0xffffffff,"1.2.8");
  if (iVar2 == 0) {
    sVar5 = sVar5 + 1;
    ppcVar6 = &pcStack_110;
    pcStack_110 = hello;
    unaff_RBP = 1;
    puStack_f8 = puVar19;
    do {
      if ((sStack_100 == sVar5) || (pcVar15 <= pcStack_e8)) goto LAB_00102f22;
      uStack_f0 = 1;
      uStack_108 = 1;
      pcStack_120 = (code *)0x102f17;
      iVar2 = deflate(ppcVar6,0);
    } while (iVar2 == 0);
    pcStack_120 = (code *)0x102f22;
    test_deflate_cold_4();
LAB_00102f22:
    do {
      uStack_f0 = 1;
      uVar16 = 4;
      pcStack_120 = (code *)0x102f38;
      iVar2 = deflate();
    } while (iVar2 == 0);
    if (iVar2 != 1) {
      pcStack_120 = (code *)0x102f65;
      test_deflate_cold_3();
      goto LAB_00102f65;
    }
    pcStack_120 = (code *)0x102f4b;
    uVar3 = deflateEnd(&pcStack_110);
    if (uVar3 == 0) {
      return;
    }
  }
  else {
LAB_00102f65:
    pcStack_120 = (code *)0x102f6c;
    test_deflate_cold_1();
    uVar3 = extraout_EAX_00;
  }
  uVar17 = (ulong)uVar3;
  pcStack_120 = test_inflate;
  test_deflate_cold_2();
  pcStack_138 = hello;
  *__s1 = 0x65676162726167;
  uStack_170 = 0;
  uStack_168 = 0;
  uStack_160 = 0;
  uStack_1a8 = 0;
  pcVar14 = "1.2.8";
  pcStack_1b8 = (code *)0x102fc9;
  uVar12 = uVar11;
  uStack_1b0 = uVar17;
  pcStack_140 = pcVar15;
  sStack_130 = sVar5;
  puStack_128 = puVar19;
  pcStack_120 = (code *)unaff_RBP;
  iVar2 = inflateInit_(&uStack_1b0,"1.2.8",0x70);
  puVar21 = (ulong *)hello;
  if (iVar2 == 0) {
    unaff_RBP = 1;
    do {
      if ((uVar11 <= uStack_188) || (uVar16 <= uStack_1a0)) goto LAB_00102ffe;
      uStack_190 = 1;
      uStack_1a8 = 1;
      pcVar14 = (char *)0x0;
      pcStack_1b8 = (code *)0x102ff5;
      iVar2 = inflate(&uStack_1b0);
    } while (iVar2 == 0);
    if (iVar2 != 1) {
      pcStack_1b8 = (code *)0x103042;
      test_inflate_cold_4();
      puVar21 = &uStack_1b0;
      goto LAB_00103042;
    }
LAB_00102ffe:
    pcStack_1b8 = (code *)0x103006;
    uVar3 = inflateEnd(&uStack_1b0);
    puVar21 = &uStack_1b0;
    if (uVar3 != 0) goto LAB_00103049;
    pcVar14 = hello;
    pcStack_1b8 = (code *)0x103019;
    puVar20 = __s1;
    iVar2 = strcmp((char *)__s1,hello);
    puVar21 = &uStack_1b0;
    if (iVar2 == 0) {
      pcStack_1b8 = (code *)0x10302e;
      printf("inflate(): %s\n",__s1);
      return;
    }
  }
  else {
LAB_00103042:
    pcStack_1b8 = (code *)0x103049;
    test_inflate_cold_1();
    uVar3 = extraout_EAX_01;
LAB_00103049:
    puVar20 = (ulong *)(ulong)uVar3;
    pcStack_1b8 = (code *)0x103050;
    test_inflate_cold_2();
  }
  pcStack_1b8 = test_large_deflate;
  test_inflate_cold_3();
  ppuVar23 = &puStack_248;
  uStack_208 = 0;
  uStack_200 = 0;
  uStack_1f8 = 0;
  uVar17 = 1;
  lVar8 = 0x70;
  pcStack_250 = (code *)0x103096;
  pcStack_1d0 = (char *)puVar21;
  ppcStack_1c8 = ppcVar6;
  uStack_1c0 = uVar11;
  pcStack_1b8 = (code *)uVar16;
  iVar2 = deflateInit_(&puStack_248,1,"1.2.8");
  if (iVar2 == 0) {
    uVar17 = 0;
    pcStack_250 = (code *)0x1030b6;
    puStack_248 = extraout_RDX_00;
    uStack_240 = (uint)uVar12;
    puStack_230 = puVar20;
    uStack_228 = (uint)pcVar14;
    iVar2 = deflate();
    if (iVar2 != 0) goto LAB_0010314e;
    if (uStack_240 != 0) goto LAB_00103155;
    pcStack_250 = (code *)0x1030d8;
    deflateParams(&puStack_248,0,0);
    uStack_240 = (uint)pcVar14 >> 1;
    pcVar14 = (char *)(ulong)uStack_240;
    uVar17 = 0;
    pcStack_250 = (code *)0x1030ed;
    puStack_248 = puVar20;
    iVar2 = deflate(&puStack_248);
    if (iVar2 != 0) goto LAB_0010315a;
    pcStack_250 = (code *)0x103106;
    deflateParams(&puStack_248,9,1);
    uVar17 = 0;
    pcStack_250 = (code *)0x103117;
    puStack_248 = extraout_RDX_00;
    uStack_240 = (uint)uVar12;
    iVar2 = deflate(&puStack_248);
    if (iVar2 != 0) goto LAB_00103161;
    uVar17 = 4;
    pcStack_250 = (code *)0x103128;
    iVar2 = deflate(&puStack_248);
    ppuVar23 = &puStack_248;
    if (iVar2 != 1) goto LAB_00103168;
    pcStack_250 = (code *)0x103135;
    uVar3 = deflateEnd(&puStack_248);
    ppuVar23 = &puStack_248;
    if (uVar3 == 0) {
      return;
    }
  }
  else {
    pcStack_250 = (code *)0x10314e;
    test_large_deflate_cold_1();
LAB_0010314e:
    pcStack_250 = (code *)0x103155;
    test_large_deflate_cold_2();
LAB_00103155:
    pcStack_250 = (code *)0x10315a;
    test_large_deflate_cold_3();
LAB_0010315a:
    ppuVar23 = (ulong **)pcVar14;
    pcStack_250 = (code *)0x103161;
    test_large_deflate_cold_4();
LAB_00103161:
    pcStack_250 = (code *)0x103168;
    test_large_deflate_cold_5();
LAB_00103168:
    pcStack_250 = (code *)0x10316d;
    test_large_deflate_cold_6();
    uVar3 = extraout_EAX_02;
  }
  uVar11 = (ulong)uVar3;
  pcStack_250 = test_large_inflate;
  test_large_deflate_cold_7();
  *extraout_RDX_01 = 0x65676162726167;
  uStack_298 = 0;
  uStack_290 = 0;
  uStack_288 = 0;
  uStack_2d0 = (undefined4)uVar17;
  pcVar14 = "1.2.8";
  pcStack_2e8 = (code *)0x1031c4;
  uStack_2d8 = uVar11;
  uStack_268 = uVar12;
  puStack_260 = puVar20;
  pcStack_250 = (code *)ppuVar23;
  iVar2 = inflateInit_(&uStack_2d8,"1.2.8",0x70);
  if (iVar2 == 0) {
    puVar20 = &uStack_2d8;
    do {
      uStack_2b8 = (undefined4)lVar8;
      pcVar14 = (char *)0x0;
      pcStack_2e8 = (code *)0x1031e0;
      iVar2 = inflate(puVar20);
    } while (iVar2 == 0);
    if (iVar2 != 1) {
      pcStack_2e8 = (code *)0x103227;
      test_large_inflate_cold_4();
      goto LAB_00103227;
    }
    pcStack_2e8 = (code *)0x1031f3;
    uVar3 = inflateEnd(&uStack_2d8);
    if (uVar3 != 0) goto LAB_0010322e;
    uVar17 = uVar17 >> 1;
    uVar11 = uStack_2b0;
    if (uStack_2b0 == uVar17 + lVar8 * 2) {
      pcStack_2e8 = (code *)0x103214;
      puts("large_inflate(): OK");
      return;
    }
  }
  else {
LAB_00103227:
    pcStack_2e8 = (code *)0x10322e;
    test_large_inflate_cold_1();
    uVar3 = extraout_EAX_03;
LAB_0010322e:
    uVar11 = (ulong)uVar3;
    pcStack_2e8 = (code *)0x103235;
    test_large_inflate_cold_2();
  }
  pcStack_2e8 = test_flush;
  test_large_inflate_cold_3();
  pcStack_380 = (code *)0x10325a;
  lStack_300 = lVar8;
  puStack_2f8 = puVar20;
  uStack_2f0 = uVar17;
  sVar5 = strlen(hello);
  uStack_330 = 0;
  uStack_328 = 0;
  uStack_320 = 0;
  uVar16 = 0xffffffff;
  ppcVar6 = (char **)0x70;
  pcStack_380 = (code *)0x103287;
  iVar2 = deflateInit_(&pcStack_370,0xffffffff,"1.2.8");
  if (iVar2 == 0) {
    pcStack_370 = hello;
    uStack_368 = 3;
    uStack_350 = *(undefined4 *)pcVar14;
    uVar16 = 3;
    pcStack_380 = (code *)0x1032ad;
    uStack_358 = uVar11;
    iVar2 = deflate();
    if (iVar2 != 0) goto LAB_001032fa;
    *(char *)(uVar11 + 3) = *(char *)(uVar11 + 3) + '\x01';
    uStack_368 = (int)sVar5 - 2;
    sVar5 = (size_t)uStack_368;
    uVar16 = 4;
    pcStack_380 = (code *)0x1032cc;
    uVar3 = deflate();
    if (1 < uVar3) goto LAB_00103301;
    pcStack_380 = (code *)0x1032db;
    uVar3 = deflateEnd(&pcStack_370);
    if (uVar3 == 0) {
      *(undefined8 *)pcVar14 = uStack_348;
      return;
    }
  }
  else {
    pcStack_380 = (code *)0x1032fa;
    test_flush_cold_1();
LAB_001032fa:
    pcStack_380 = (code *)0x103301;
    test_flush_cold_2();
LAB_00103301:
    pcStack_380 = (code *)0x103308;
    test_flush_cold_4();
    uVar3 = extraout_EAX_04;
  }
  uVar12 = (ulong)uVar3;
  pcStack_380 = test_sync;
  test_flush_cold_3();
  pcStack_390 = hello;
  *extraout_RDX_02 = 0x65676162726167;
  uStack_3c8 = 0;
  uStack_3c0 = 0;
  uStack_3b8 = 0;
  uStack_400 = 2;
  pcVar15 = "1.2.8";
  pcStack_418 = (code *)0x103362;
  uStack_408 = uVar12;
  pcStack_398 = pcVar14;
  uStack_388 = uVar11;
  pcStack_380 = (code *)sVar5;
  iVar2 = inflateInit_(&uStack_408,"1.2.8",0x70);
  if (iVar2 == 0) {
    uStack_3e8 = SUB84(ppcVar6,0);
    pcVar15 = (char *)0x0;
    pcStack_418 = (code *)0x10337f;
    inflate(&uStack_408);
    uStack_400 = (int)uVar16 - 2;
    uVar16 = (ulong)uStack_400;
    pcStack_418 = (code *)0x103390;
    iVar2 = inflateSync(&uStack_408);
    if (iVar2 != 0) goto LAB_001033da;
    pcVar15 = (char *)0x4;
    pcStack_418 = (code *)0x1033a3;
    iVar2 = inflate(&uStack_408);
    if (iVar2 != -3) goto LAB_001033e1;
    pcStack_418 = (code *)0x1033b2;
    uVar3 = inflateEnd(&uStack_408);
    if (uVar3 == 0) {
      pcStack_418 = (code *)0x1033c7;
      printf("after inflateSync(): hel%s\n",extraout_RDX_02);
      return;
    }
  }
  else {
    pcStack_418 = (code *)0x1033da;
    test_sync_cold_1();
LAB_001033da:
    pcStack_418 = (code *)0x1033e1;
    test_sync_cold_2();
LAB_001033e1:
    pcStack_418 = (code *)0x1033e6;
    test_sync_cold_3();
    uVar3 = extraout_EAX_05;
  }
  puVar21 = (ulong *)(ulong)uVar3;
  pcStack_418 = test_dict_deflate;
  test_sync_cold_4();
  uStack_458 = 0;
  uStack_450 = 0;
  uStack_448 = 0;
  uVar13 = 9;
  pcVar14 = (char *)0x70;
  pcStack_4a0 = (code *)0x103424;
  uStack_420 = uVar16;
  pcStack_418 = (code *)ppcVar6;
  iVar2 = deflateInit_(&pcStack_498,9,"1.2.8");
  if (iVar2 == 0) {
    uVar13 = 0x104004;
    pcStack_4a0 = (code *)0x10343c;
    iVar2 = deflateSetDictionary(&pcStack_498,"hello",6);
    if (iVar2 != 0) goto LAB_0010349a;
    dictId = uStack_438;
    uStack_478 = SUB84(pcVar15,0);
    pcStack_498 = hello;
    pcStack_4a0 = (code *)0x103465;
    puStack_480 = (undefined1 *)puVar21;
    sVar5 = strlen(hello);
    iStack_490 = (int)sVar5 + 1;
    uVar13 = 4;
    pcStack_4a0 = (code *)0x103478;
    iVar2 = deflate(&pcStack_498);
    ppcVar6 = &pcStack_498;
    if (iVar2 != 1) goto LAB_001034a1;
    pcStack_4a0 = (code *)0x103485;
    uVar3 = deflateEnd(&pcStack_498);
    ppcVar6 = &pcStack_498;
    if (uVar3 == 0) {
      return;
    }
  }
  else {
    pcStack_4a0 = (code *)0x10349a;
    test_dict_deflate_cold_1();
LAB_0010349a:
    pcStack_4a0 = (code *)0x1034a1;
    test_dict_deflate_cold_2();
LAB_001034a1:
    pcStack_4a0 = (code *)0x1034a6;
    test_dict_deflate_cold_3();
    uVar3 = extraout_EAX_06;
  }
  uVar11 = (ulong)uVar3;
  pcStack_4a0 = test_dict_inflate;
  test_dict_deflate_cold_4();
  builtin_strncpy(__s1_00,"garbage",8);
  uStack_4e0 = 0;
  uStack_4d8 = 0;
  uStack_4d0 = 0;
  pcVar18 = "1.2.8";
  pcStack_528 = (code *)0x1034f5;
  uStack_520 = uVar11;
  uStack_518 = uVar13;
  pcStack_4b0 = pcVar15;
  puStack_4a8 = (undefined1 *)puVar21;
  pcStack_4a0 = (code *)ppcVar6;
  iVar2 = inflateInit_(&uStack_520,"1.2.8",0x70);
  if (iVar2 == 0) {
    uStack_500 = SUB84(pcVar14,0);
    pcVar14 = "hello";
    do {
      pcVar18 = (char *)0x0;
      pcStack_528 = (code *)0x103519;
      iVar2 = inflate(&uStack_520);
      if (iVar2 == 2) {
        if (uStack_4c0 != dictId) {
          pcStack_528 = (code *)0x10358d;
          test_dict_inflate_cold_2();
          puVar21 = &uStack_520;
          goto LAB_0010358d;
        }
        pcVar18 = "hello";
        pcStack_528 = (code *)0x103543;
        iVar2 = inflateSetDictionary(&uStack_520,"hello",6);
      }
      else if (iVar2 == 1) goto LAB_0010354e;
    } while (iVar2 == 0);
    pcStack_528 = (code *)0x10354e;
    test_dict_inflate_cold_5();
LAB_0010354e:
    pcStack_528 = (code *)0x103556;
    iVar2 = inflateEnd(&uStack_520);
    puVar21 = &uStack_520;
    if (iVar2 == 0) {
      pcVar18 = hello;
      pcStack_528 = (code *)0x103569;
      pcVar15 = __s1_00;
      iVar4 = strcmp(__s1_00,hello);
      iVar2 = (int)pcVar15;
      puVar21 = &uStack_520;
      if (iVar4 == 0) {
        pcStack_528 = (code *)0x10357e;
        printf("inflate with dictionary: %s\n",__s1_00);
        return;
      }
      goto LAB_0010359b;
    }
  }
  else {
LAB_0010358d:
    pcStack_528 = (code *)0x103594;
    test_dict_inflate_cold_1();
    iVar2 = extraout_EAX_07;
  }
  pcStack_528 = (code *)0x10359b;
  test_dict_inflate_cold_3();
LAB_0010359b:
  pcStack_528 = main;
  test_dict_inflate_cold_4();
  auStack_548[0] = 40000;
  puStack_538 = (undefined1 *)puVar21;
  pcStack_530 = pcVar14;
  pcStack_528 = (code *)unaff_RBP;
  pcVar14 = (char *)zlibVersion();
  if (*pcVar14 == '1') {
    pcVar14 = (char *)zlibVersion();
    iVar4 = strcmp(pcVar14,"1.2.8");
    if (iVar4 != 0) {
      main_cold_2();
    }
    uVar10 = zlibCompileFlags();
    printf("zlib version %s = 0x%04x, compile flags = 0x%lx\n","1.2.8",0x1280,uVar10);
    compr_00 = (Byte *)calloc(40000,1);
    uncompr_00 = (Byte *)calloc(40000,1);
    if ((compr_00 != (Byte *)0x0) && (uncompr_00 != (Byte *)0x0)) {
      test_compress(compr_00,40000,uncompr_00,40000);
      if (iVar2 < 2) {
        pcVar14 = "foo.gz";
      }
      else {
        pcVar14 = *(char **)(pcVar18 + 8);
      }
      test_gzio(pcVar14,uncompr_00,40000);
      test_deflate(compr_00,40000);
      test_inflate(compr_00,40000,uncompr_00,40000);
      test_large_deflate(compr_00,40000,uncompr_00,40000);
      test_large_inflate(compr_00,40000,uncompr_00,40000);
      test_flush(compr_00,auStack_548);
      test_sync(compr_00,auStack_548[0],uncompr_00,40000);
      auStack_548[0] = 40000;
      test_dict_deflate(compr_00,40000);
      test_dict_inflate(compr_00,40000,uncompr_00,40000);
      free(compr_00);
      free(uncompr_00);
      return;
    }
  }
  else {
    main_cold_1();
  }
  puts("out of memory");
  exit(1);
}

Assistant:

void test_compress(compr, comprLen, uncompr, uncomprLen)
    Byte *compr, *uncompr;
    uLong comprLen, uncomprLen;
{
    int err;
    uLong len = (uLong)strlen(hello)+1;

    err = compress(compr, &comprLen, (const Bytef*)hello, len);
    CHECK_ERR(err, "compress");

    strcpy((char*)uncompr, "garbage");

    err = uncompress(uncompr, &uncomprLen, compr, comprLen);
    CHECK_ERR(err, "uncompress");

    if (strcmp((char*)uncompr, hello)) {
        fprintf(stderr, "bad uncompress\n");
        exit(1);
    } else {
        printf("uncompress(): %s\n", (char *)uncompr);
    }
}